

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_utils.cpp
# Opt level: O1

int bidfx_public_api::price::subject::SubjectUtils::BinarySearch
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *components,string *key)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  ulong unaff_RBP;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar4 = (int)((ulong)((long)(components->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(components->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 5) + -1;
  uVar6 = 0;
  while( true ) {
    if (iVar4 < (int)uVar6) {
      return ~uVar6;
    }
    uVar5 = iVar4 + uVar6 >> 1 & 0xfffffffe;
    uVar7 = (ulong)uVar5;
    pbVar1 = (components->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(components->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar7)
    break;
    iVar3 = std::__cxx11::string::compare((string *)(pbVar1 + uVar7));
    if (iVar3 < 0) {
      uVar6 = uVar5 + 2;
      bVar2 = true;
    }
    else if (iVar3 == 0) {
      bVar2 = false;
      unaff_RBP = uVar7;
    }
    else {
      iVar4 = uVar5 - 2;
      bVar2 = true;
    }
    if (!bVar2) {
      return (int)unaff_RBP;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
}

Assistant:

int SubjectUtils::BinarySearch(const std::vector<std::string>* components, const std::string& key)
{
    int low = 0;
    int high = static_cast<int>(components->size() - 1);

    while (low <= high)
    {
        int mid = low + high >> 2 << 1;
        int cmp = components->at(mid).compare(key);

        if (cmp < 0)
        {
            low = mid + 2;
        }
        else if (cmp > 0)
        {
            high = mid - 2;
        }
        else
        {
            return mid;
        }
    }

    return -1 - low;
}